

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O3

ProgramHeaders * __thiscall pstack::Elf::Object::getSegments(Object *this,Word type)

{
  ProgramHeaders *in_RAX;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  p_Var2 = (this->programHeaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var3 = &(this->programHeaders)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var3->_M_header;
    do {
      bVar4 = p_Var2[1]._M_color < type;
      if (!bVar4) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[bVar4];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var1 != p_Var3) && (p_Var1[1]._M_color <= type)) {
      return (ProgramHeaders *)&p_Var1[1]._M_parent;
    }
  }
  if (getSegments(unsigned_int)::empty == '\0') {
    getSegments();
  }
  else {
    in_RAX = &getSegments::empty;
  }
  return in_RAX;
}

Assistant:

const Object::ProgramHeaders &
Object::getSegments(Word type) const
{
    auto it = programHeaders.find(type);
    if (it == programHeaders.end()) {
        static const ProgramHeaders empty;
        return empty;
    }
    return it->second;
}